

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsdtar.c
# Opt level: O3

void long_help(void)

{
  char cVar1;
  int iVar2;
  char *__s1;
  char *pcVar3;
  
  __s1 = lafe_getprogname();
  fflush(_stderr);
  iVar2 = strcmp(__s1,"bsdtar");
  pcVar3 = "(bsdtar)";
  if (iVar2 == 0) {
    pcVar3 = "";
  }
  printf("%s%s: manipulate archive files\n",__s1,pcVar3);
  pcVar3 = 
  "First option must be a mode specifier:\n  -c Create  -r Add/Replace  -t List  -u Update  -x Extract\nCommon Options:\n  -b #  Use # 512-byte records per I/O block\n  -f <filename>  Location of archive (default /dev/st0)\n  -v    Verbose\n  -w    Interactive\nCreate: %p -c [options] [<file> | <dir> | @<archive> | -C <dir> ]\n  <file>, <dir>  add these items to archive\n  -z, -j, -J, --lzma  Compress archive with gzip/bzip2/xz/lzma\n  --format {ustar|pax|cpio|shar}  Select archive format\n  --exclude <pattern>  Skip files that match pattern\n  -C <dir>  Change to <dir> before processing remaining files\n  @<archive>  Add entries from <archive> to output\nList: %p -t [options] [<patterns>]\n  <patterns>  If specified, list only entries that match\nExtract: %p -x [options] [<patterns>]\n  <patterns>  If specified, extract only entries that match\n  -k    Keep (don\'t overwrite) existing files\n  -m    Don\'t restore modification times\n  -O    Write entries to stdout, don\'t restore to disk\n  -p    Restore permissions (including ACLs, owner, file flags)\n"
  ;
  do {
    cVar1 = *pcVar3;
    if (cVar1 == '%') {
      if (pcVar3[1] != 'p') {
        iVar2 = 0x25;
        goto LAB_0010ff3f;
      }
      pcVar3 = pcVar3 + 1;
      fputs(__s1,_stdout);
    }
    else {
      if (cVar1 == '\0') {
        version();
        return;
      }
      iVar2 = (int)cVar1;
LAB_0010ff3f:
      putchar(iVar2);
    }
    pcVar3 = pcVar3 + 1;
  } while( true );
}

Assistant:

static void
long_help(void)
{
	const char	*prog;
	const char	*p;

	prog = lafe_getprogname();

	fflush(stderr);

	p = (strcmp(prog,"bsdtar") != 0) ? "(bsdtar)" : "";
	printf("%s%s: manipulate archive files\n", prog, p);

	for (p = long_help_msg; *p != '\0'; p++) {
		if (*p == '%') {
			if (p[1] == 'p') {
				fputs(prog, stdout);
				p++;
			} else
				putchar('%');
		} else
			putchar(*p);
	}
	version();
}